

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O2

tuple<std::vector<int,_std::allocator<int>_>_> * __thiscall
cppqc::detail::TupleGeneratorHelper_unGen<0,std::vector<int,std::allocator<int>>>::
unGen<std::tuple<cppqc::Generator<std::vector<int,std::allocator<int>>>>>
          (tuple<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,
          TupleGeneratorHelper_unGen<0,std::vector<int,std::allocator<int>>> *this,RngEngine *rng,
          size_t size,tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *generators)

{
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  (**(code **)(**(long **)size + 0x10))(&local_28,*(long **)size,this,rng);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_28._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_28._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<T> unGen(RngEngine& rng,
                             std::size_t size,
                             const Generators& generators) {
    return std::tuple<T>(std::get<offset>(generators).unGen(rng, size));
  }